

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug-test.c++
# Opt level: O1

string * kj::_::anon_unknown_0::fileLine(string *__return_storage_ptr__,string *file,int line)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  kj *this;
  char *pcVar2;
  pointer pcVar3;
  undefined8 uVar4;
  size_t sVar5;
  size_t extraout_RDX;
  StringPtr SVar6;
  char buffer [32];
  char acStack_48 [32];
  
  this = (kj *)(file->_M_dataplus)._M_p;
  sVar5 = strlen((char *)this);
  SVar6.content.size_ = extraout_RDX;
  SVar6.content.ptr = (char *)(sVar5 + 1);
  SVar6 = trimSourceFilename(this,SVar6);
  pcVar2 = (char *)file->_M_string_length;
  strlen(SVar6.content.ptr);
  ::std::__cxx11::string::_M_replace((ulong)file,0,pcVar2,(ulong)SVar6.content.ptr);
  ::std::__cxx11::string::push_back((char)file);
  sprintf(acStack_48,"%d",(ulong)(uint)line);
  ::std::__cxx11::string::append((char *)file);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar3 = (file->_M_dataplus)._M_p;
  paVar1 = &file->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar4 = *(undefined8 *)((long)&file->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = file->_M_string_length;
  (file->_M_dataplus)._M_p = (pointer)paVar1;
  file->_M_string_length = 0;
  (file->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string fileLine(std::string file, int line) {
  file = trimSourceFilename(file.c_str()).cStr();

  file += ':';
  char buffer[32];
  sprintf(buffer, "%d", line);
  file += buffer;
  return file;
}